

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

uint * ON_BinarySearchUnsignedIntArray(uint key,uint *base,size_t nel)

{
  uint uVar1;
  size_t sVar2;
  uint d;
  size_t i;
  size_t nel_local;
  uint *base_local;
  uint key_local;
  
  if ((nel != 0) && (base != (uint *)0x0)) {
    if (key < *base) {
      return (uint *)0x0;
    }
    if (key == *base) {
      return base;
    }
    if (base[nel - 1] < key) {
      return (uint *)0x0;
    }
    sVar2 = nel;
    nel_local = (size_t)base;
    if (key == base[nel - 1]) {
      return base + (nel - 1);
    }
    while (i = sVar2, i != 0) {
      sVar2 = i >> 1;
      uVar1 = *(uint *)(nel_local + sVar2 * 4);
      if (uVar1 <= key) {
        if (key <= uVar1) {
          return (uint *)(nel_local + sVar2 * 4);
        }
        nel_local = (sVar2 + 1) * 4 + nel_local;
        sVar2 = i - (sVar2 + 1);
      }
    }
  }
  return (uint *)0x0;
}

Assistant:

const unsigned int* ON_BinarySearchUnsignedIntArray( unsigned int key, const unsigned int* base, size_t nel )
{
  if (nel > 0 && base )
  {
    size_t i;
    unsigned int d;

    // The end tests are not necessary, but they
    // seem to provide overall speed improvement
    // for the types of searches that call this
    // function.
    d = base[0];
    if ( key < d )
      return 0;
    if ( key == d )
      return base;

    d = base[nel-1];
    if ( key > d )
      return 0;
    if ( key == d )
      return (base + (nel-1));

    while ( nel > 0 )
    {
      i = nel/2;
      d = base[i];
      if ( key < d )
      {
        nel = i;
      }
      else if ( key > d )
      {
        i++;
        base += i;
        nel -= i;
      }
      else
      {
        return base+i;
      }
    }
  }
  return 0;
}